

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAdvancedBlendEquationTests.cpp
# Opt level: O0

GLenum deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::getEquation
                 (BlendEquation equation)

{
  GLenum local_c;
  BlendEquation equation_local;
  
  switch(equation) {
  case BLEND_EQUATION_MULTIPLY:
    local_c = 0x9294;
    break;
  case BLEND_EQUATION_SCREEN:
    local_c = 0x9295;
    break;
  case BLEND_EQUATION_OVERLAY:
    local_c = 0x9296;
    break;
  case BLEND_EQUATION_DARKEN:
    local_c = 0x9297;
    break;
  case BLEND_EQUATION_LIGHTEN:
    local_c = 0x9298;
    break;
  case BLEND_EQUATION_COLORDODGE:
    local_c = 0x9299;
    break;
  case BLEND_EQUATION_COLORBURN:
    local_c = 0x929a;
    break;
  case BLEND_EQUATION_HARDLIGHT:
    local_c = 0x929b;
    break;
  case BLEND_EQUATION_SOFTLIGHT:
    local_c = 0x929c;
    break;
  case BLEND_EQUATION_DIFFERENCE:
    local_c = 0x929e;
    break;
  case BLEND_EQUATION_EXCLUSION:
    local_c = 0x92a0;
    break;
  case BLEND_EQUATION_HSL_HUE:
    local_c = 0x92ad;
    break;
  case BLEND_EQUATION_HSL_SATURATION:
    local_c = 0x92ae;
    break;
  case BLEND_EQUATION_HSL_COLOR:
    local_c = 0x92af;
    break;
  case BLEND_EQUATION_HSL_LUMINOSITY:
    local_c = 0x92b0;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

glw::GLenum getEquation (BlendEquation equation)
{
	switch (equation)
	{
		case BLEND_EQUATION_MULTIPLY:          return GL_MULTIPLY;
		case BLEND_EQUATION_SCREEN:            return GL_SCREEN;
		case BLEND_EQUATION_OVERLAY:           return GL_OVERLAY;
		case BLEND_EQUATION_DARKEN:            return GL_DARKEN;
		case BLEND_EQUATION_LIGHTEN:           return GL_LIGHTEN;
		case BLEND_EQUATION_COLORDODGE:        return GL_COLORDODGE;
		case BLEND_EQUATION_COLORBURN:         return GL_COLORBURN;
		case BLEND_EQUATION_HARDLIGHT:         return GL_HARDLIGHT;
		case BLEND_EQUATION_SOFTLIGHT:         return GL_SOFTLIGHT;
		case BLEND_EQUATION_DIFFERENCE:        return GL_DIFFERENCE;
		case BLEND_EQUATION_EXCLUSION:         return GL_EXCLUSION;
		case BLEND_EQUATION_HSL_HUE:           return GL_HSL_HUE;
		case BLEND_EQUATION_HSL_SATURATION:    return GL_HSL_SATURATION;
		case BLEND_EQUATION_HSL_COLOR:         return GL_HSL_COLOR;
		case BLEND_EQUATION_HSL_LUMINOSITY:    return GL_HSL_LUMINOSITY;
		default:
			DE_FATAL("Equation not supported.");
	}
	return DE_NULL;
}